

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

Number * __thiscall xe::ri::List::allocItem<xe::ri::Number>(List *this)

{
  Number *pNVar1;
  Number *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pNVar1 = (Number *)operator_new(0xa0);
  (pNVar1->super_Item).m_type = TYPE_NUMBER;
  (pNVar1->super_Item)._vptr_Item = (_func_int **)&PTR__Number_0011e900;
  (pNVar1->name)._M_dataplus._M_p = (pointer)&(pNVar1->name).field_2;
  (pNVar1->name)._M_string_length = 0;
  (pNVar1->name).field_2._M_local_buf[0] = '\0';
  (pNVar1->description)._M_dataplus._M_p = (pointer)&(pNVar1->description).field_2;
  (pNVar1->description)._M_string_length = 0;
  (pNVar1->description).field_2._M_local_buf[0] = '\0';
  (pNVar1->unit)._M_dataplus._M_p = (pointer)&(pNVar1->unit).field_2;
  (pNVar1->unit)._M_string_length = 0;
  (pNVar1->unit).field_2._M_local_buf[0] = '\0';
  (pNVar1->tag)._M_dataplus._M_p = (pointer)&(pNVar1->tag).field_2;
  (pNVar1->tag)._M_string_length = 0;
  (pNVar1->tag).field_2._M_local_buf[0] = '\0';
  (pNVar1->value).m_type = TYPE_EMPTY;
  local_18 = pNVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pNVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}